

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000183f30 = 0x2d2d2d2d2d2d2d;
    uRam0000000000183f37._0_1_ = '-';
    uRam0000000000183f37._1_1_ = '-';
    uRam0000000000183f37._2_1_ = '-';
    uRam0000000000183f37._3_1_ = '-';
    uRam0000000000183f37._4_1_ = '-';
    uRam0000000000183f37._5_1_ = '-';
    uRam0000000000183f37._6_1_ = '-';
    uRam0000000000183f37._7_1_ = '-';
    DAT_00183f20 = '-';
    DAT_00183f20_1._0_1_ = '-';
    DAT_00183f20_1._1_1_ = '-';
    DAT_00183f20_1._2_1_ = '-';
    DAT_00183f20_1._3_1_ = '-';
    DAT_00183f20_1._4_1_ = '-';
    DAT_00183f20_1._5_1_ = '-';
    DAT_00183f20_1._6_1_ = '-';
    uRam0000000000183f28 = 0x2d2d2d2d2d2d2d;
    DAT_00183f2f = 0x2d;
    DAT_00183f10 = '-';
    DAT_00183f10_1._0_1_ = '-';
    DAT_00183f10_1._1_1_ = '-';
    DAT_00183f10_1._2_1_ = '-';
    DAT_00183f10_1._3_1_ = '-';
    DAT_00183f10_1._4_1_ = '-';
    DAT_00183f10_1._5_1_ = '-';
    DAT_00183f10_1._6_1_ = '-';
    uRam0000000000183f18._0_1_ = '-';
    uRam0000000000183f18._1_1_ = '-';
    uRam0000000000183f18._2_1_ = '-';
    uRam0000000000183f18._3_1_ = '-';
    uRam0000000000183f18._4_1_ = '-';
    uRam0000000000183f18._5_1_ = '-';
    uRam0000000000183f18._6_1_ = '-';
    uRam0000000000183f18._7_1_ = '-';
    DAT_00183f00 = '-';
    DAT_00183f00_1._0_1_ = '-';
    DAT_00183f00_1._1_1_ = '-';
    DAT_00183f00_1._2_1_ = '-';
    DAT_00183f00_1._3_1_ = '-';
    DAT_00183f00_1._4_1_ = '-';
    DAT_00183f00_1._5_1_ = '-';
    DAT_00183f00_1._6_1_ = '-';
    uRam0000000000183f08._0_1_ = '-';
    uRam0000000000183f08._1_1_ = '-';
    uRam0000000000183f08._2_1_ = '-';
    uRam0000000000183f08._3_1_ = '-';
    uRam0000000000183f08._4_1_ = '-';
    uRam0000000000183f08._5_1_ = '-';
    uRam0000000000183f08._6_1_ = '-';
    uRam0000000000183f08._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000183ef8._0_1_ = '-';
    uRam0000000000183ef8._1_1_ = '-';
    uRam0000000000183ef8._2_1_ = '-';
    uRam0000000000183ef8._3_1_ = '-';
    uRam0000000000183ef8._4_1_ = '-';
    uRam0000000000183ef8._5_1_ = '-';
    uRam0000000000183ef8._6_1_ = '-';
    uRam0000000000183ef8._7_1_ = '-';
    DAT_00183f3f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}